

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::opt::GraphicsRobustAccessPass::IsCompatibleModule(GraphicsRobustAccessPass *this)

{
  bool bVar1;
  IRContext *pIVar2;
  DiagnosticStream *pDVar3;
  Module *this_00;
  string local_988;
  DiagnosticStream local_968;
  uint32_t local_78c;
  Instruction *pIStack_788;
  AddressingModel addressing_model;
  Instruction *inst;
  DiagnosticStream local_5a8;
  DiagnosticStream local_3d0;
  DiagnosticStream local_1f8;
  FeatureManager *local_20;
  FeatureManager *feature_mgr;
  GraphicsRobustAccessPass *this_local;
  
  feature_mgr = (FeatureManager *)this;
  pIVar2 = Pass::context(&this->super_Pass);
  local_20 = IRContext::get_feature_mgr(pIVar2);
  bVar1 = FeatureManager::HasCapability(local_20,Shader);
  if (bVar1) {
    bVar1 = FeatureManager::HasCapability(local_20,VariablePointers);
    if (bVar1) {
      Fail(&local_3d0,this);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_3d0,
                          (char (*) [55])"Can\'t process modules with VariablePointers capability");
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3d0);
    }
    else {
      bVar1 = FeatureManager::HasCapability(local_20,VariablePointersStorageBuffer);
      if (bVar1) {
        Fail(&local_5a8,this);
        pDVar3 = DiagnosticStream::operator<<
                           (&local_5a8,
                            (char (*) [68])
                            "Can\'t process modules with VariablePointersStorageBuffer capability");
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        DiagnosticStream::~DiagnosticStream(&local_5a8);
      }
      else {
        bVar1 = FeatureManager::HasCapability(local_20,RuntimeDescriptorArray);
        if (bVar1) {
          Fail((DiagnosticStream *)&inst,this);
          pDVar3 = DiagnosticStream::operator<<
                             ((DiagnosticStream *)&inst,
                              (char (*) [64])
                              "Can\'t process modules with RuntimeDescriptorArrayEXT capability");
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&inst);
        }
        else {
          pIVar2 = Pass::context(&this->super_Pass);
          this_00 = IRContext::module(pIVar2);
          pIStack_788 = Module::GetMemoryModel(this_00);
          local_78c = Instruction::GetSingleWordOperand(pIStack_788,0);
          if (local_78c == 0) {
            this_local._4_4_ = SPV_SUCCESS;
          }
          else {
            Fail(&local_968,this);
            pDVar3 = DiagnosticStream::operator<<
                               (&local_968,
                                (char (*) [42])"Addressing model must be Logical.  Found ");
            Instruction::PrettyPrint_abi_cxx11_(&local_988,pIStack_788,0);
            pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_988);
            this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
            std::__cxx11::string::~string((string *)&local_988);
            DiagnosticStream::~DiagnosticStream(&local_968);
          }
        }
      }
    }
  }
  else {
    Fail(&local_1f8,this);
    pDVar3 = DiagnosticStream::operator<<
                       (&local_1f8,(char (*) [32])"Can only process Shader modules");
    this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t GraphicsRobustAccessPass::IsCompatibleModule() {
  auto* feature_mgr = context()->get_feature_mgr();
  if (!feature_mgr->HasCapability(spv::Capability::Shader))
    return Fail() << "Can only process Shader modules";
  if (feature_mgr->HasCapability(spv::Capability::VariablePointers))
    return Fail() << "Can't process modules with VariablePointers capability";
  if (feature_mgr->HasCapability(
          spv::Capability::VariablePointersStorageBuffer))
    return Fail() << "Can't process modules with VariablePointersStorageBuffer "
                     "capability";
  if (feature_mgr->HasCapability(spv::Capability::RuntimeDescriptorArrayEXT)) {
    // These have a RuntimeArray outside of Block-decorated struct.  There
    // is no way to compute the array length from within SPIR-V.
    return Fail() << "Can't process modules with RuntimeDescriptorArrayEXT "
                     "capability";
  }

  {
    auto* inst = context()->module()->GetMemoryModel();
    const auto addressing_model =
        spv::AddressingModel(inst->GetSingleWordOperand(0));
    if (addressing_model != spv::AddressingModel::Logical)
      return Fail() << "Addressing model must be Logical.  Found "
                    << inst->PrettyPrint();
  }
  return SPV_SUCCESS;
}